

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

void __thiscall DEnterKey::SetMenuMessage(DEnterKey *this,int which)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  FOptionMenuItem *pFVar4;
  DObject *pDVar5;
  bool bVar6;
  FName local_24;
  
  pDVar5 = (this->super_DMenu).mParentMenu.field_0.o;
  if ((pDVar5 != (DObject *)0x0) && ((pDVar5->ObjectFlags & 0x20) != 0)) {
    (this->super_DMenu).mParentMenu.field_0.p = (DMenu *)0x0;
    pDVar5 = (DObject *)0x0;
  }
  pPVar1 = DOptionMenu::RegistrationInfo.MyClass;
  if (pDVar5->Class == (PClass *)0x0) {
    iVar2 = (**pDVar5->_vptr_DObject)(pDVar5);
    pDVar5->Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar3 = pDVar5->Class;
  bVar6 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar6) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar6 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (bVar6) {
    pFVar4 = DOptionMenu::GetItem
                       ((DOptionMenu *)(this->super_DMenu).mParentMenu.field_0.p,&local_24);
    if (pFVar4 != (FOptionMenuItem *)0x0) {
      (*(pFVar4->super_FListMenuItem)._vptr_FListMenuItem[10])(pFVar4,0,which);
    }
  }
  return;
}

Assistant:

void SetMenuMessage(int which)
	{
		if (mParentMenu->IsKindOf(RUNTIME_CLASS(DOptionMenu)))
		{
			DOptionMenu *m = barrier_cast<DOptionMenu*>(mParentMenu);
			FListMenuItem *it = m->GetItem(NAME_Controlmessage);
			if (it != NULL)
			{
				it->SetValue(0, which);
			}
		}
	}